

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O2

void __thiscall GYMPlayer::LoadTag(GYMPlayer *this,char *tagName,void *data,size_t maxlen)

{
  char *pcVar1;
  mapped_type *this_00;
  iterator iVar2;
  char *endPtr;
  allocator local_61;
  string local_60;
  key_type local_40;
  
  pcVar1 = (char *)memchr(data,0,maxlen);
  endPtr = (char *)(maxlen + (long)data);
  if (pcVar1 != (char *)0x0) {
    endPtr = pcVar1;
  }
  GetUTF8String_abi_cxx11_(&local_60,this,(char *)data,endPtr);
  std::__cxx11::string::string((string *)&local_40,tagName,&local_61);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->_tagData,&local_40);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,tagName,(allocator *)&local_40);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->_tagData)._M_t,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  local_60._M_dataplus._M_p = *(pointer *)(iVar2._M_node + 1);
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&this->_tagList,(char **)&local_60);
  local_60._M_dataplus._M_p = *(pointer *)(iVar2._M_node + 2);
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&this->_tagList,(char **)&local_60);
  return;
}

Assistant:

void GYMPlayer::LoadTag(const char* tagName, const void* data, size_t maxlen)
{
	const char* startPtr = (const char*)data;
	const char* endPtr = (const char*)memchr(startPtr, '\0', maxlen);
	if (endPtr == NULL)
		endPtr = startPtr + maxlen;
	
	_tagData[tagName] = GetUTF8String(startPtr, endPtr);
	
	std::map<std::string, std::string>::const_iterator mapIt = _tagData.find(tagName);
	_tagList.push_back(mapIt->first.c_str());
	_tagList.push_back(mapIt->second.c_str());
	return;
}